

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

void doemit(parse *p,sop op,sop opnd)

{
  long lVar1;
  long lVar2;
  
  if (p->error == 0) {
    if (0x3ffffff < opnd) {
      __assert_fail("opnd < 1<<OPSHIFT",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x5d7,"void doemit()");
    }
    lVar1 = p->ssize;
    lVar2 = p->slen;
    if (lVar1 <= lVar2) {
      enlarge(p,((lVar1 + 1) / 2) * 3);
      lVar1 = p->ssize;
      lVar2 = p->slen;
    }
    if (lVar1 <= lVar2) {
      __assert_fail("p->slen < p->ssize",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x5dc,"void doemit()");
    }
    p->slen = lVar2 + 1;
    p->strip[lVar2] = opnd | op;
  }
  return;
}

Assistant:

static void
doemit(p, op, opnd)
struct parse *p;
sop op;
sop opnd;
{
	/* avoid making error situations worse */
	if (p->error != 0)
		return;

	/* deal with oversize operands ("can't happen", more or less) */
	assert(opnd < 1<<OPSHIFT);

	/* deal with undersized strip */
	if (p->slen >= p->ssize)
		enlarge(p, (p->ssize+1) / 2 * 3);	/* +50% */
	assert(p->slen < p->ssize);

	/* finally, it's all reduced to the easy case */
	p->strip[p->slen++] = SOP(op, opnd);
}